

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lengauer_tarjan.cpp
# Opt level: O2

int __thiscall LengauerTarjan::init(LengauerTarjan *this,EVP_PKEY_CTX *ctx)

{
  uint uVar1;
  pointer pvVar2;
  long lVar3;
  int iVar4;
  int extraout_EAX;
  ulong uVar5;
  size_type __n;
  ulong uVar6;
  uint uVar7;
  allocator_type local_69;
  _Vector_base<int,_std::allocator<int>_> local_68;
  _Vector_base<int,_std::allocator<int>_> local_50;
  ulong local_38;
  
  uVar5 = ((long)(this->in).
                 super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish -
          (long)(this->in).
                super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start) / 0x18;
  iVar4 = (int)uVar5;
  __n = (size_type)iVar4;
  local_68._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_68._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_68._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::vector((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
            *)&local_50,__n,(value_type *)&local_68,&local_69);
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::_M_move_assign(&preds,&local_50);
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::~vector((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             *)&local_50);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_68);
  local_68._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_68._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_68._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::vector((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
            *)&local_50,__n,(value_type *)&local_68,&local_69);
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::_M_move_assign(&succs,&local_50);
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::~vector((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             *)&local_50);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_68);
  uVar6 = 0;
  local_38 = uVar5 & 0xffffffff;
  if (iVar4 < 1) {
    local_38 = uVar6;
  }
  for (; uVar6 != local_38; uVar6 = uVar6 + 1) {
    uVar7 = 0;
    while( true ) {
      uVar5 = (ulong)uVar7;
      pvVar2 = (this->ou).
               super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      lVar3 = *(long *)&pvVar2[uVar6].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data;
      if ((ulong)((long)pvVar2[uVar6].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_finish - lVar3 >> 2) <= uVar5) break;
      uVar1 = *(uint *)(lVar3 + uVar5 * 4);
      iVar4 = (*this->_vptr_LengauerTarjan[10])(this,(ulong)uVar1);
      if ((((char)iVar4 == '\0') &&
          (iVar4 = (*this->_vptr_LengauerTarjan[9])
                             (this,(ulong)*(uint *)(*(long *)&(this->en).
                                                                                                                            
                                                  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start
                                                  [(int)uVar1].
                                                  super__Vector_base<int,_std::allocator<int>_>.
                                                  _M_impl.super__Vector_impl_data + 4)),
          (char)iVar4 == '\0')) &&
         (lVar3 = *(long *)&(this->en).
                            super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start
                            [*(int *)(*(long *)&(this->ou).
                                                super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                                ._M_impl.super__Vector_impl_data._M_start[uVar6].
                                                super__Vector_base<int,_std::allocator<int>_>.
                                                _M_impl.super__Vector_impl_data + uVar5 * 4)].
                            super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data, uVar6 != *(uint *)(lVar3 + 4))) {
        std::vector<int,_std::allocator<int>_>::push_back
                  (succs.
                   super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start + uVar6,
                   (value_type_conflict1 *)(lVar3 + 4));
      }
      uVar7 = uVar7 + 1;
    }
  }
  local_68._M_impl.super__Vector_impl_data._M_start._0_4_ = 0xffffffff;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)&local_50,__n,(value_type_conflict1 *)&local_68,
             (allocator_type *)&local_69);
  std::vector<int,_std::allocator<int>_>::_M_move_assign(&this->parent,&local_50);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_50);
  local_68._M_impl.super__Vector_impl_data._M_start._0_4_ = 0xffffffff;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)&local_50,__n,(value_type_conflict1 *)&local_68,
             (allocator_type *)&local_69);
  std::vector<int,_std::allocator<int>_>::_M_move_assign(&this->vertex,&local_50);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_50);
  local_68._M_impl.super__Vector_impl_data._M_start._0_4_ = 0xffffffff;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)&local_50,__n,(value_type_conflict1 *)&local_68,
             (allocator_type *)&local_69);
  std::vector<int,_std::allocator<int>_>::_M_move_assign(&this->semi,&local_50);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_50);
  local_68._M_impl.super__Vector_impl_data._M_start._0_4_ = 0xffffffff;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)&local_50,__n,(value_type_conflict1 *)&local_68,
             (allocator_type *)&local_69);
  std::vector<int,_std::allocator<int>_>::_M_move_assign(&this->idom,&local_50);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_50);
  this->count = -1;
  local_68._M_impl.super__Vector_impl_data._M_start._0_4_ = 0xffffffff;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)&local_50,__n,(value_type_conflict1 *)&local_68,
             (allocator_type *)&local_69);
  std::vector<int,_std::allocator<int>_>::_M_move_assign(&this->ancestor,&local_50);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_50);
  local_68._M_impl.super__Vector_impl_data._M_start._0_4_ = 0xffffffff;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)&local_50,__n,(value_type_conflict1 *)&local_68,
             (allocator_type *)&local_69);
  std::vector<int,_std::allocator<int>_>::_M_move_assign(&this->label,&local_50);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_50);
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)&local_50,__n,&this->root,
             (allocator_type *)&local_68);
  std::vector<int,_std::allocator<int>_>::_M_move_assign(&child,&local_50);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_50);
  local_68._M_impl.super__Vector_impl_data._M_start =
       (pointer)((ulong)local_68._M_impl.super__Vector_impl_data._M_start._4_4_ << 0x20);
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)&local_50,__n,(value_type_conflict1 *)&local_68,
             (allocator_type *)&local_69);
  std::vector<int,_std::allocator<int>_>::_M_move_assign(&size_,&local_50);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_50);
  return extraout_EAX;
}

Assistant:

void LengauerTarjan::init() {
	const int n = static_cast<int>(in.size());
	preds = std::vector<std::vector<int> >(n, std::vector<int>());
	succs = std::vector<std::vector<int> >(n, std::vector<int>());
	for (int i = 0; i < n; i++) {
		// succs.push_back(vector<int>());
		// cout <<"Succs of "<<i<<": ";
		for (unsigned int j = 0; j < ou[i].size(); j++) {
			const int e = ou[i][j];
			if (ignore_edge(e)) {
				continue;
			}
			const int o = en[e][1];
			if (ignore_node(o)) {
				continue;
			}
			if (i != en[ou[i][j]][1]) {
				succs[i].push_back(en[ou[i][j]][1]);
				// cout <<en[ou[i][j]][1]<<", ";
			}
		}
		// cout<<endl;
	}

	parent = std::vector<int>(n, -1);
	vertex = std::vector<int>(n, -1);
	semi = std::vector<int>(n, -1);
	idom = std::vector<int>(n, -1);

	count = -1;

	ancestor = std::vector<int>(n, -1);
	label = std::vector<int>(n, -1);

	child = std::vector<int>(n, root);
	size_ = std::vector<int>(n, 0);
}